

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall mp::BasicSolver::set_warn_cb(BasicSolver *this,AMPLS_Warning_Callback_T cb)

{
  std::function<std::pair<char_const*,char_const*>(char_const*)>::operator=
            ((function<std::pair<const_char_*,_const_char_*>_(const_char_*)> *)this,
             (anon_class_8_1_3fcf651d *)cb);
  return;
}

Assistant:

void BasicSolver::set_warn_cb(AMPLS_Warning_Callback_T cb) {
  assert(cb);
  warn_cb_ = [cb](const char* info) {
    const char *wt=0, *wd=0;
    cb(info, &wt, &wd);
    return std::pair {wt, wd};
  };
}